

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O2

cl_command_queue __thiscall
CLIntercept::getCommandBufferCommandQueue
          (CLIntercept *this,cl_uint numQueues,cl_command_queue *queues,cl_command_buffer_khr cmdbuf
          )

{
  _Base_ptr platform;
  iterator iVar1;
  CLdispatchX *pCVar2;
  cl_command_queue p_Var3;
  allocator local_4d;
  cl_uint numQueues_local;
  cl_command_buffer_khr cmdbuf_local;
  cl_command_queue local_40;
  vector<_cl_command_queue_*,_std::allocator<_cl_command_queue_*>_> queues_1;
  
  if (queues != (cl_command_queue *)0x0 && numQueues != 0) {
    return *queues;
  }
  numQueues_local = numQueues;
  cmdbuf_local = cmdbuf;
  std::mutex::lock(&this->m_Mutex);
  local_40 = (cl_command_queue)0x0;
  iVar1 = std::
          _Rb_tree<_cl_command_buffer_khr_*,_std::pair<_cl_command_buffer_khr_*const,__cl_platform_id_*>,_std::_Select1st<std::pair<_cl_command_buffer_khr_*const,__cl_platform_id_*>_>,_std::less<_cl_command_buffer_khr_*>,_std::allocator<std::pair<_cl_command_buffer_khr_*const,__cl_platform_id_*>_>_>
          ::find(&(this->m_CommandBufferInfoMap)._M_t,&cmdbuf_local);
  if ((_Rb_tree_header *)iVar1._M_node !=
      &(this->m_CommandBufferInfoMap)._M_t._M_impl.super__Rb_tree_header) {
    platform = iVar1._M_node[1]._M_parent;
    pCVar2 = dispatchX(this,(cl_platform_id)platform);
    if (pCVar2->clGetCommandBufferInfoKHR ==
        (_func_cl_int_cl_command_buffer_khr_cl_command_buffer_info_khr_size_t_void_ptr_size_t_ptr *)
        0x0) {
      std::__cxx11::string::string((string *)&queues_1,"clGetCommandBufferInfoKHR",&local_4d);
      getExtensionFunctionAddress(this,(cl_platform_id)platform,(string *)&queues_1);
      std::__cxx11::string::~string((string *)&queues_1);
    }
    pCVar2 = dispatchX(this,(cl_platform_id)platform);
    if (pCVar2->clGetCommandBufferInfoKHR !=
        (_func_cl_int_cl_command_buffer_khr_cl_command_buffer_info_khr_size_t_void_ptr_size_t_ptr *)
        0x0) {
      (*pCVar2->clGetCommandBufferInfoKHR)(cmdbuf_local,0x1295,4,&numQueues_local,(size_t *)0x0);
      if ((ulong)numQueues_local != 0) {
        if (numQueues_local == 1) {
          (*pCVar2->clGetCommandBufferInfoKHR)(cmdbuf_local,0x1294,8,&local_40,(size_t *)0x0);
          p_Var3 = local_40;
        }
        else {
          std::vector<_cl_command_queue_*,_std::allocator<_cl_command_queue_*>_>::vector
                    (&queues_1,(ulong)numQueues_local,(allocator_type *)&local_4d);
          (*pCVar2->clGetCommandBufferInfoKHR)
                    (cmdbuf_local,0x1294,
                     (long)queues_1.
                           super__Vector_base<_cl_command_queue_*,_std::allocator<_cl_command_queue_*>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)queues_1.
                           super__Vector_base<_cl_command_queue_*,_std::allocator<_cl_command_queue_*>_>
                           ._M_impl.super__Vector_impl_data._M_start,
                     queues_1.
                     super__Vector_base<_cl_command_queue_*,_std::allocator<_cl_command_queue_*>_>.
                     _M_impl.super__Vector_impl_data._M_start,(size_t *)0x0);
          p_Var3 = *queues_1.
                    super__Vector_base<_cl_command_queue_*,_std::allocator<_cl_command_queue_*>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          std::_Vector_base<_cl_command_queue_*,_std::allocator<_cl_command_queue_*>_>::
          ~_Vector_base(&queues_1.
                         super__Vector_base<_cl_command_queue_*,_std::allocator<_cl_command_queue_*>_>
                       );
        }
        goto LAB_00168b47;
      }
    }
  }
  p_Var3 = (cl_command_queue)0x0;
LAB_00168b47:
  pthread_mutex_unlock((pthread_mutex_t *)&this->m_Mutex);
  return p_Var3;
}

Assistant:

cl_command_queue CLIntercept::getCommandBufferCommandQueue(
    cl_uint numQueues,
    const cl_command_queue* queues,
    cl_command_buffer_khr cmdbuf )
{
    if( numQueues != 0 && queues != NULL )
    {
        return queues[0];
    }

    std::lock_guard<std::mutex> lock(m_Mutex);

    cl_command_queue    queue = NULL;

    CCommandBufferInfoMap::iterator iter = m_CommandBufferInfoMap.find( cmdbuf );
    if( iter != m_CommandBufferInfoMap.end() )
    {
        cl_platform_id  platform = iter->second;
        if( dispatchX(platform).clGetCommandBufferInfoKHR == NULL )
        {
            getExtensionFunctionAddress(
                platform,
                "clGetCommandBufferInfoKHR" );
        }

        const auto& dispatchX = this->dispatchX(platform);
        if( dispatchX.clGetCommandBufferInfoKHR )
        {
            dispatchX.clGetCommandBufferInfoKHR(
                cmdbuf,
                CL_COMMAND_BUFFER_NUM_QUEUES_KHR,
                sizeof( numQueues ),
                &numQueues,
                NULL );
            if( numQueues == 1)
            {
                dispatchX.clGetCommandBufferInfoKHR(
                    cmdbuf,
                    CL_COMMAND_BUFFER_QUEUES_KHR,
                    sizeof( queue ),
                    &queue,
                    NULL );
            }
            else if( numQueues > 1 )
            {
                std::vector<cl_command_queue> queues(numQueues);
                dispatchX.clGetCommandBufferInfoKHR(
                    cmdbuf,
                    CL_COMMAND_BUFFER_QUEUES_KHR,
                    queues.size() * sizeof(queues[0]),
                    queues.data(),
                    NULL );
                queue = queues[0];
            }
        }
    }

    return queue;
}